

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag>::
crossover(storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::maximize_tag> *this,
         local_context *ctx,bit_array *x,bit_array *first,bit_array *second)

{
  uint uVar1;
  underlying_type uVar2;
  underlying_type uVar3;
  result_type_conflict rVar4;
  int i;
  ulong uVar5;
  
  uVar1 = (x->super_bit_array_impl).m_block_size;
  for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
    uVar2 = bit_array_impl::block(&first->super_bit_array_impl,(int)uVar5);
    uVar3 = bit_array_impl::block(&second->super_bit_array_impl,(int)uVar5);
    rVar4 = std::uniform_int_distribution<unsigned_long>::operator()(&ctx->crossover_dist,&ctx->rng)
    ;
    (x->super_bit_array_impl).m_data._M_t.
    super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[uVar5] =
         uVar3 & rVar4 | ~rVar4 & uVar2;
  }
  return;
}

Assistant:

void crossover(local_context& ctx,
                   bit_array& x,
                   const bit_array& first,
                   const bit_array& second)
    {
        const auto block_size = x.block_size();
        for (int i = 0; i != block_size; ++i) {
            const auto x1 = first.block(i);
            const auto x2 = second.block(i);

            x.set_block(i, ((x1 ^ x2) & ctx.crossover_dist(ctx.rng)) ^ x1);
        }
    }